

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_1::multiplePatchReferenceVertexCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *levels,int numPatches)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  lVar3 = 10;
  do {
    iVar1 = referencePrimitiveCount(primitiveType,spacingMode,usePointMode,levels,levels + 2);
    uVar2 = usePointMode - 1 | 1;
    if (primitiveType < TESSPRIMITIVETYPE_LAST && !usePointMode) {
      uVar2 = *(uint *)(&DAT_01c39e30 + (ulong)primitiveType * 4);
    }
    iVar4 = iVar4 + uVar2 * iVar1;
    levels = levels + 6;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return iVar4;
}

Assistant:

static int multiplePatchReferenceVertexCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* levels, int numPatches)
{
	int result = 0;
	for (int patchNdx = 0; patchNdx < numPatches; patchNdx++)
		result += referenceVertexCount(primitiveType, spacingMode, usePointMode, &levels[6*patchNdx + 0], &levels[6*patchNdx + 2]);
	return result;
}